

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItemPrivate::updateHiddenStatus
          (QTreeWidgetItemPrivate *this,QTreeWidgetItem *item,bool inserting)

{
  byte bVar1;
  bool bVar2;
  QTreeModel *__s;
  QTreeWidgetItem *this_00;
  QTreeWidgetItem **t;
  qsizetype qVar3;
  byte in_DL;
  long in_RSI;
  long in_FS_OFFSET;
  int i;
  QTreeWidgetItem *parent;
  QTreeModel *model;
  QTreeWidgetItem *child;
  QModelIndex index;
  QStack<QTreeWidgetItem_*> parents;
  QTreeWidgetItem **in_stack_ffffffffffffff68;
  QList<QTreeWidgetItem_*> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined1 hide;
  QTreeWidgetItem *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 local_40 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_30;
  QTreeWidgetItem *local_28;
  Data *local_20;
  QModelIndex *local_18;
  long local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_10 = in_RSI;
  __s = QTreeWidgetItem::treeModel
                  (in_stack_ffffffffffffff80,
                   (QTreeWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (__s != (QTreeModel *)0x0) {
    local_28 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x914435);
    QStack<QTreeWidgetItem_*>::push
              ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    while( true ) {
      hide = (undefined1)((uint)in_stack_ffffffffffffff7c >> 0x18);
      bVar2 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x914451);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      this_00 = QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x914466);
      if (((byte)this_00->d->field_0x20 >> 2 & 1) != 0) {
        local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_30.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QTreeModel::index((QTreeModel *)local_40,(char *)__s,(int)this_00);
        in_stack_ffffffffffffff70 = *(QList<QTreeWidgetItem_*> **)(local_10 + 0x28);
        QModelIndex::row((QModelIndex *)local_40);
        QModelIndex::parent((QModelIndex *)this_00);
        QTreeView::setRowHidden
                  ((QTreeView *)CONCAT17(bVar1,in_stack_ffffffffffffff90),(int)((ulong)__s >> 0x20),
                   (QModelIndex *)this_00,(bool)hide);
      }
      in_stack_ffffffffffffff7c = 0;
      while( true ) {
        t = (QTreeWidgetItem **)(long)in_stack_ffffffffffffff7c;
        qVar3 = QList<QTreeWidgetItem_*>::size(&this_00->children);
        if (qVar3 <= (long)t) break;
        QList<QTreeWidgetItem_*>::at(in_stack_ffffffffffffff70,(qsizetype)t);
        QStack<QTreeWidgetItem_*>::push((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff70,t);
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
      }
    }
    QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x91457d);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItemPrivate::updateHiddenStatus(QTreeWidgetItem *item, bool inserting)
{
    QTreeModel *model = item->treeModel();
    if (!model)
        return;
    QStack<QTreeWidgetItem *> parents;
    parents.push(item);
    while (!parents.isEmpty()) {
        QTreeWidgetItem *parent = parents.pop();
        if (parent->d->hidden) {
            const QModelIndex index = model->index(parent, 0);
            item->view->setRowHidden(index.row(), index.parent(), inserting);
        }
        for (int i = 0; i < parent->children.size(); ++i) {
            QTreeWidgetItem *child = parent->children.at(i);
            parents.push(child);
        }
    }
}